

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFunctionDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
ValueFunctionDecPOMDPDiscrete::SetCached
          (ValueFunctionDecPOMDPDiscrete *this,Index sI,Index JOHI,double val)

{
  value_type *pvVar1;
  key_type local_4;
  
  local_4 = sI * (int)this->_m_nrJOH + JOHI;
  pvVar1 = boost::unordered::detail::
           table_impl<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
           ::operator[](&(this->_m_cache).table_,&local_4);
  pvVar1->second = val;
  return;
}

Assistant:

void ValueFunctionDecPOMDPDiscrete::SetCached(Index sI, Index JOHI, double val)
{
    _m_cache[GetCombinedIndex(sI, JOHI)]=val;
}